

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O1

void __thiscall Fifteen::setTilesNumeric(Fifteen *this)

{
  pointer puVar1;
  pointer puVar2;
  int *piVar3;
  vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
  *pvVar4;
  uint uVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar6;
  QString *pQVar7;
  pointer puVar8;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var9;
  long lVar10;
  QByteArrayView QVar11;
  QString tileColor;
  QFont font;
  size_t nullValue;
  key_type local_a8;
  undefined4 uStack_a4;
  undefined8 uStack_a0;
  undefined8 local_98;
  QArrayData *local_90;
  char16_t *local_88;
  qsizetype local_80;
  vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
  *local_78;
  Fifteen *local_70;
  QFont local_68 [16];
  QArrayData *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  ulong local_38;
  
  pvVar6 = Controller::getValues
                     ((this->controller)._M_t.
                      super___uniq_ptr_impl<Controller,_std::default_delete<Controller>_>._M_t.
                      super__Tuple_impl<0UL,_Controller_*,_std::default_delete<Controller>_>.
                      super__Head_base<0UL,_Controller_*,_false>._M_head_impl);
  Controller::getFontSize
            ((this->controller)._M_t.
             super___uniq_ptr_impl<Controller,_std::default_delete<Controller>_>._M_t.
             super__Tuple_impl<0UL,_Controller_*,_std::default_delete<Controller>_>.
             super__Head_base<0UL,_Controller_*,_false>._M_head_impl);
  QFont::QFont(local_68);
  QFont::setPixelSize((int)local_68);
  pQVar7 = Options::getTileColor();
  local_90 = &((pQVar7->d).d)->super_QArrayData;
  local_88 = (pQVar7->d).ptr;
  local_80 = (pQVar7->d).size;
  if (local_90 != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&local_90->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&local_90->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_70 = this;
  local_78 = TilesBoard::getTiles
                       ((this->tilesBoard)._M_t.
                        super___uniq_ptr_impl<TilesBoard,_std::default_delete<TilesBoard>_>._M_t.
                        super__Tuple_impl<0UL,_TilesBoard_*,_std::default_delete<TilesBoard>_>.
                        super__Head_base<0UL,_TilesBoard_*,_false>._M_head_impl);
  puVar1 = (local_78->
           super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (local_78->
           super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (puVar1 != puVar2) {
    lVar10 = 0;
    do {
      pQVar7 = *(QString **)
                ((long)&(puVar1->_M_t).
                        super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>._M_t.
                        super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
                        super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl + lVar10);
      QString::number((ulong)&local_a8,
                      (int)*(undefined8 *)
                            ((long)(pvVar6->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_start + lVar10) + 1);
      QAbstractButton::setText(pQVar7);
      piVar3 = (int *)CONCAT44(uStack_a4,local_a8);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_a4,local_a8),2,8);
        }
      }
      QWidget::setStyleSheet
                (*(QString **)
                  ((long)&(puVar1->_M_t).
                          super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>._M_t
                          .super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
                          super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl + lVar10));
      QWidget::setFont(*(QFont **)
                        ((long)&(puVar1->_M_t).
                                super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>
                                .super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl + lVar10))
      ;
      puVar8 = (pointer)((long)&puVar1[1]._M_t.
                                super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>
                                .super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl + lVar10);
      lVar10 = lVar10 + 8;
    } while (puVar8 != puVar2);
  }
  uVar5 = Controller::getNullValue
                    ((local_70->controller)._M_t.
                     super___uniq_ptr_impl<Controller,_std::default_delete<Controller>_>._M_t.
                     super__Tuple_impl<0UL,_Controller_*,_std::default_delete<Controller>_>.
                     super__Head_base<0UL,_Controller_*,_false>._M_head_impl);
  local_38 = (ulong)uVar5;
  _Var9 = std::
          __find_if<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                    ((pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start,
                     (pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_finish);
  pvVar4 = local_78;
  pQVar7 = *(QString **)
            ((long)_Var9._M_current +
            ((long)(local_78->
                   super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start -
            (long)(pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start));
  local_a8 = EMPTY;
  std::
  map<TileColor,_const_QString,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_const_QString>_>_>
  ::at(&Maps::tileColorStyle,&local_a8);
  QWidget::setStyleSheet(pQVar7);
  pQVar7 = *(QString **)
            ((long)_Var9._M_current +
            ((long)(pvVar4->
                   super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start -
            (long)(pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start));
  QVar11.m_data = (storage_type *)0x0;
  QVar11.m_size = (qsizetype)&local_a8;
  QString::fromUtf8(QVar11);
  local_58 = (QArrayData *)CONCAT44(uStack_a4,local_a8);
  uStack_50 = uStack_a0;
  local_48 = local_98;
  QAbstractButton::setText(pQVar7);
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,8);
    }
  }
  if (local_90 != (QArrayData *)0x0) {
    LOCK();
    (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_90,2,8);
    }
  }
  QFont::~QFont(local_68);
  return;
}

Assistant:

void Fifteen::setTilesNumeric()
{
    const auto& values = controller->getValues();

    size_t fontSize = controller->getFontSize();
    QFont font;
    font.setPixelSize( fontSize );
    auto tileColor = Options::getTileColor();

    auto& tiles = tilesBoard->getTiles();
    size_t valuesIndex = 0;
    for ( auto& tile : tiles )
    {
        tile->setText( QString::number( values[ valuesIndex++ ] + 1 ));
        tile->setStyleSheet( tileColor );
        tile->setFont( font );
    }

    size_t nullValue = controller->getNullValue();
    auto iter = std::find( values.begin(), values.end(), nullValue );
    tiles[ std::distance( values.begin(), iter )]->setStyleSheet( Maps::tileColorStyle.at( TileColor::EMPTY ));
    tiles[ std::distance( values.begin(), iter )]->setText( nullptr );
}